

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string_view __thiscall stream_buffer::next_token(stream_buffer *this)

{
  long lVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  size_t sVar9;
  byte bVar10;
  istream *__in;
  uint uVar11;
  string_view sVar12;
  
  lVar4 = (long)this->current_token_buffer;
  sVar9 = (this->token)._M_elems[lVar4].current;
  bVar10 = (this->token)._M_elems[lVar4].buffer[sVar9];
  if (bVar10 == 0) {
    uVar8 = (long)(this->current_token_buffer + 1) % 10;
    iVar5 = (int)uVar8;
    this->current_token_buffer = iVar5;
    uVar8 = uVar8 & 0xffffffff;
    pcVar6 = (char *)0x0;
    __in = this->is;
    sVar3 = 0;
    if (*(int *)(__in + *(long *)(*(long *)__in + -0x18) + 0x20) != 0) goto LAB_00125c7d;
    (this->token)._M_elems[iVar5].buffer[0] = '\0';
    while( true ) {
      pbVar2 = std::operator>>(__in,(this->token)._M_elems[(int)uVar8].buffer);
      uVar11 = this->current_token_buffer;
      lVar4 = (long)(int)uVar11;
      bVar10 = (this->token)._M_elems[lVar4].buffer[0];
      if (((byte)pbVar2[*(long *)(*(long *)pbVar2 + -0x18) + 0x20] & 5) != 0) break;
      if (bVar10 != 0) {
        if (bVar10 != 0x5c) {
          (this->token)._M_elems[lVar4].current = 0;
          sVar9 = 0;
          goto LAB_00125b65;
        }
        std::istream::ignore((long)this->is,-1);
        uVar11 = this->current_token_buffer;
      }
      uVar8 = (ulong)uVar11;
      __in = this->is;
    }
    (this->token)._M_elems[lVar4].current = 0;
    sVar3 = 0;
    pcVar6 = (char *)0x0;
    sVar9 = 0;
    if (bVar10 == 0) goto LAB_00125c7d;
  }
LAB_00125b65:
  (this->token)._M_elems[lVar4].current = sVar9 + 1;
  pcVar6 = (this->token)._M_elems[lVar4].buffer + sVar9;
  sVar3 = 1;
  uVar11 = (byte)(this->token)._M_elems[lVar4].buffer[sVar9] - 0x2a;
  if (((0x34 < uVar11) || ((0x1a0000001d000bU >> ((ulong)uVar11 & 0x3f) & 1) == 0)) &&
     (bVar7 = (this->token)._M_elems[lVar4].buffer[sVar9 + 1], bVar7 != 0)) {
    lVar1 = 0;
    while (((bVar7 != 0 &&
            ((0x34 < bVar7 - 0x2a ||
             ((0x1a0000001d000bU >> ((ulong)(bVar7 - 0x2a) & 0x3f) & 1) == 0)))) &&
           (((9 < (int)(char)bVar10 - 0x30U &&
             ((0x2e < bVar10 || ((0x680000000000U >> ((ulong)bVar10 & 0x3f) & 1) == 0)))) ||
            (((int)(char)bVar7 - 0x30U < 10 ||
             ((bVar7 - 0x2b < 0x3b &&
              ((0x40000000400000dU >> ((ulong)(bVar7 - 0x2b) & 0x3f) & 1) != 0))))))))) {
      (this->token)._M_elems[lVar4].current = sVar9 + 2 + lVar1;
      bVar7 = (this->token)._M_elems[lVar4].buffer[lVar1 + sVar9 + 2];
      lVar1 = lVar1 + 1;
    }
    sVar3 = lVar1 + 1;
  }
LAB_00125c7d:
  sVar12._M_str = pcVar6;
  sVar12._M_len = sVar3;
  return sVar12;
}

Assistant:

std::string_view next_token() noexcept
    {
        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0') {
            current_token_buffer =
              (current_token_buffer + 1) % stream_buffer_size;
            if (!is.good())
                return std::string_view();

            token[current_token_buffer].buffer[0] = '\0';
            while (is >> token[current_token_buffer].buffer) {
                if (token[current_token_buffer].buffer[0] == '\\') {
                    is.ignore(std::numeric_limits<std::streamsize>::max(),
                              '\n');
                    continue;
                }

                if (token[current_token_buffer].buffer[0] == '\0')
                    continue;

                break;
            }

            token[current_token_buffer].current = 0;
            if (token[current_token_buffer].buffer[0] == '\0')
                return std::string_view();
        }

        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0')
            return std::string_view();

        bool starts_with_number =
          starts_with_a_number(token[current_token_buffer]
                                 .buffer[token[current_token_buffer].current]);

        std::size_t start = token[current_token_buffer].current++;

        if (is_separator(token[current_token_buffer].buffer[start]))
            return std::string_view(&token[current_token_buffer].buffer[start],
                                    1);

        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0')
            return std::string_view(&token[current_token_buffer].buffer[start],
                                    1);

        while (token[current_token_buffer]
                 .buffer[token[current_token_buffer].current] != '\0') {
            if (is_separator(token[current_token_buffer]
                               .buffer[token[current_token_buffer].current]))
                break;

            if (starts_with_number &&
                !is_number(token[current_token_buffer]
                             .buffer[token[current_token_buffer].current]))
                break;

            ++token[current_token_buffer].current;
        }

        return std::string_view(&token[current_token_buffer].buffer[start],
                                token[current_token_buffer].current - start);
    }